

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::writeVectorConstructor<2>
               (ostream *str,Vector<float,_2> *v)

{
  Vector<float,_2> *pVVar1;
  ostream *poVar2;
  float *pfVar3;
  int precision;
  string local_40;
  int local_1c;
  Vector<float,_2> *pVStack_18;
  int ndx;
  Vector<float,_2> *v_local;
  ostream *str_local;
  
  pVStack_18 = v;
  v_local = (Vector<float,_2> *)str;
  poVar2 = std::operator<<(str,"vec");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
  std::operator<<(poVar2,"(");
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    if (local_1c != 0) {
      std::operator<<((ostream *)v_local,", ");
    }
    pVVar1 = v_local;
    pfVar3 = tcu::Vector<float,_2>::operator[](pVStack_18,local_1c);
    de::floatToString_abi_cxx11_(&local_40,(de *)&DAT_00000001,*pfVar3,precision);
    std::operator<<((ostream *)pVVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::operator<<((ostream *)v_local,")");
  return;
}

Assistant:

void writeVectorConstructor (std::ostream& str, const tcu::Vector<float, Size>& v)
{
	str << "vec" << Size << "(";
	for (int ndx = 0; ndx < Size; ndx++)
	{
		if (ndx != 0)
			str << ", ";
		str << de::floatToString(v[ndx], 1);
	}
	str << ")";
}